

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  uint16_t uVar1;
  int iVar2;
  uint16_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  
  iVar2 = (bm->high_low_container).size;
  if (iVar2 < 1) {
    uVar5 = 0;
  }
  else {
    uVar4 = iVar2 - 1;
    uVar1 = (bm->high_low_container).keys[uVar4];
    uVar3 = container_maximum((bm->high_low_container).containers[uVar4],
                              (bm->high_low_container).typecodes[uVar4]);
    uVar5 = CONCAT22(uVar1,uVar3);
  }
  return uVar5;
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}